

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_intrusive_list.cpp
# Opt level: O3

void __thiscall IntrusiveList_Empty_Test::TestBody(IntrusiveList_Empty_Test *this)

{
  __uniq_ptr_impl<(anonymous_namespace)::value,_std::default_delete<(anonymous_namespace)::value>_>
  _Var1;
  char *message;
  intrusive_list<(anonymous_namespace)::value> v;
  AssertHelper local_38;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_30;
  internal local_28 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  intrusive_list<(anonymous_namespace)::value> local_18;
  
  pstore::broker::intrusive_list<(anonymous_namespace)::value>::intrusive_list(&local_18);
  local_38.data_._0_4_ = 0;
  local_30._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  for (_Var1._M_t.
       super__Tuple_impl<0UL,_(anonymous_namespace)::value_*,_std::default_delete<(anonymous_namespace)::value>_>
       .super__Head_base<0UL,_(anonymous_namespace)::value_*,_false>._M_head_impl =
            *(tuple<(anonymous_namespace)::value_*,_std::default_delete<(anonymous_namespace)::value>_>
              *)&((_Tuple_impl<0UL,_(anonymous_namespace)::value_*,_std::default_delete<(anonymous_namespace)::value>_>
                   *)((long)local_18.head_._M_t.
                            super___uniq_ptr_impl<(anonymous_namespace)::value,_std::default_delete<(anonymous_namespace)::value>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_(anonymous_namespace)::value_*,_std::default_delete<(anonymous_namespace)::value>_>
                            .super__Head_base<0UL,_(anonymous_namespace)::value_*,_false>.
                            _M_head_impl + 0x10))->
                 super__Head_base<0UL,_(anonymous_namespace)::value_*,_false>;
      _Var1._M_t.
      super__Tuple_impl<0UL,_(anonymous_namespace)::value_*,_std::default_delete<(anonymous_namespace)::value>_>
      .super__Head_base<0UL,_(anonymous_namespace)::value_*,_false>._M_head_impl !=
      (tuple<(anonymous_namespace)::value_*,_std::default_delete<(anonymous_namespace)::value>_>)
      local_18.tail_._M_t.
      super___uniq_ptr_impl<(anonymous_namespace)::value,_std::default_delete<(anonymous_namespace)::value>_>
      ._M_t.
      super__Tuple_impl<0UL,_(anonymous_namespace)::value_*,_std::default_delete<(anonymous_namespace)::value>_>
      .super__Head_base<0UL,_(anonymous_namespace)::value_*,_false>._M_head_impl;
      _Var1._M_t.
      super__Tuple_impl<0UL,_(anonymous_namespace)::value_*,_std::default_delete<(anonymous_namespace)::value>_>
      .super__Head_base<0UL,_(anonymous_namespace)::value_*,_false>._M_head_impl =
           *(tuple<(anonymous_namespace)::value_*,_std::default_delete<(anonymous_namespace)::value>_>
             *)&((_Tuple_impl<0UL,_(anonymous_namespace)::value_*,_std::default_delete<(anonymous_namespace)::value>_>
                  *)((long)_Var1._M_t.
                           super__Tuple_impl<0UL,_(anonymous_namespace)::value_*,_std::default_delete<(anonymous_namespace)::value>_>
                           .super__Head_base<0UL,_(anonymous_namespace)::value_*,_false>.
                           _M_head_impl + 0x10))->
                super__Head_base<0UL,_(anonymous_namespace)::value_*,_false>) {
    local_30._M_head_impl = local_30._M_head_impl + 1;
  }
  testing::internal::CmpHelperEQ<int,long>
            (local_28,"0","std::distance (v.begin (), v.end ())",(int *)&local_38,(long *)&local_30)
  ;
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_20 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_20->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/broker/test_intrusive_list.cpp"
               ,0x22,message);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_30._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_30._M_head_impl + 8))();
    }
  }
  if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_20,local_20);
  }
  pstore::broker::intrusive_list<(anonymous_namespace)::value>::~intrusive_list(&local_18);
  return;
}

Assistant:

TEST (IntrusiveList, Empty) {
    pstore::broker::intrusive_list<value> v;
    EXPECT_EQ (0, std::distance (v.begin (), v.end ()));
}